

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshba.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  fd_set *__exceptfds;
  fd_set *__writefds;
  Hosts *__readfds;
  timeval *in_R8;
  string command;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  long local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [32];
  string local_60;
  string local_40;
  
  configDir_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_60.field_2._M_allocated_capacity = *psVar5;
    local_60.field_2._8_8_ = plVar2[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar5;
    local_60._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_60._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  readConfig(&local_60,&config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  configDir_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c0);
  __exceptfds = (fd_set *)(plVar2 + 2);
  if ((fd_set *)*plVar2 == __exceptfds) {
    local_80._16_8_ = __exceptfds->fds_bits[0];
    local_80._24_8_ = plVar2[3];
    local_80._0_8_ = (fd_set *)(local_80 + 0x10);
  }
  else {
    local_80._16_8_ = __exceptfds->fds_bits[0];
    local_80._0_8_ = (fd_set *)*plVar2;
  }
  local_80._8_8_ = plVar2[1];
  *plVar2 = (long)__exceptfds;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __readfds = &hosts;
  readHosts((string *)local_80,&hosts);
  if ((fd_set *)local_80._0_8_ != (fd_set *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_);
  }
  paVar4 = local_c0;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  iVar1 = (int)paVar4;
  if (argc != 2) {
    if (hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      display();
      iVar1 = select(iVar1,(fd_set *)__readfds,__writefds,__exceptfds,in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
      _Unwind_Resume(iVar1);
    }
    configDir_abi_cxx11_();
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 == paVar4) {
      local_b0._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_b0._8_8_ = plVar2[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar2;
    }
    local_b8 = plVar2[1];
    *plVar2 = (long)paVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_c0->_M_local_buf,local_b8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
    }
    if (local_a0 == &local_90) {
      return 0;
    }
    goto LAB_00104f41;
  }
  std::__cxx11::string::string((string *)&local_c0,argv[1],(allocator *)&local_a0);
  iVar1 = std::__cxx11::string::compare((char *)&local_c0);
  if (iVar1 == 0) {
    changeConfig();
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_c0);
    if (iVar1 == 0) {
      configDir_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_a0->_M_local_buf,local_98);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      paVar4 = &local_90;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar1 != 0) goto LAB_00104f37;
      hostsPath_abi_cxx11_();
      editFile(&local_40);
      paVar4 = &local_40.field_2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar4->_M_local_buf + -0x10) != paVar4) {
      operator_delete(*(undefined1 **)(paVar4->_M_local_buf + -0x10));
    }
  }
LAB_00104f37:
  local_a0 = local_c0;
  if (local_c0 == &local_b0) {
    return 0;
  }
LAB_00104f41:
  operator_delete(local_a0);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    readConfig(configDir() + "/config", config);
    readHosts(configDir() + "/hosts", hosts);
    if (argc == 2) {
        std::string command = argv[1];
        if (command == "key") {
            changeConfig();
        } else if (command == "config") {
            std::cout << configDir() << std::endl;
        } else if (command == "hosts") {
            editFile(hostsPath());
        }
        return 0;
    }
    if (hosts.empty()) {
        std::cout << configDir() + "/hosts is empty" << std::endl;
        return 0;
    }
    display();
    select();
    return 0;
}